

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketConnection.cpp
# Opt level: O0

void __thiscall
FIX::ThreadedSocketConnection::~ThreadedSocketConnection(ThreadedSocketConnection *this)

{
  SessionID *sessionID;
  ThreadedSocketConnection *this_local;
  
  (this->super_Responder)._vptr_Responder = (_func_int **)&PTR__ThreadedSocketConnection_00331648;
  if (this->m_pSession != (Session *)0x0) {
    Session::setResponder(this->m_pSession,(Responder *)0x0);
    sessionID = Session::getSessionID(this->m_pSession);
    Session::unregisterSession(sessionID);
  }
  std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::~set
            (&this->m_sessions);
  Parser::~Parser(&this->m_parser);
  std::__cxx11::string::~string((string *)&this->m_sourceAddress);
  std::__cxx11::string::~string((string *)&this->m_address);
  Responder::~Responder(&this->super_Responder);
  return;
}

Assistant:

ThreadedSocketConnection::~ThreadedSocketConnection() {
  if (m_pSession) {
    m_pSession->setResponder(0);
    Session::unregisterSession(m_pSession->getSessionID());
  }
}